

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O1

float __thiscall OpenMD::StringTokenizer::nextTokenAsFloat(StringTokenizer *this)

{
  _Alloc_hider _Var1;
  double dVar2;
  string token;
  string local_30;
  
  nextToken_abi_cxx11_(&local_30,this);
  _Var1._M_p = local_30._M_dataplus._M_p;
  if (local_30._M_string_length != 0) {
    do {
      if ((byte)(*_Var1._M_p | 0x20U) == 100) {
        *_Var1._M_p = 0x45;
      }
      _Var1._M_p = _Var1._M_p + 1;
    } while (_Var1._M_p != local_30._M_dataplus._M_p + local_30._M_string_length);
  }
  dVar2 = atof(local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (float)dVar2;
}

Assistant:

float StringTokenizer::nextTokenAsFloat() {
    std::string token = nextToken();
    convertFortranNumber(token);
    return (float)(atof(token.c_str()));
  }